

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp.cpp
# Opt level: O1

void __thiscall pg::PPSolver::PPSolver(PPSolver *this,Oink *oink,Game *game)

{
  ulong uVar1;
  uint *puVar2;
  
  Solver::Solver(&this->super_Solver,oink,game);
  (this->super_Solver)._vptr_Solver = (_func_int **)&PTR__PPSolver_001a7620;
  bitset::bitset(&this->Z,game->n_vertices);
  uVar1 = game->n_vertices;
  (this->Q).pointer = 0;
  puVar2 = (uint *)operator_new__((uVar1 & 0xffffffff) << 2);
  (this->Q).queue = puVar2;
  return;
}

Assistant:

PPSolver::PPSolver(Oink& oink, Game& game) : Solver(oink, game), Z(game.nodecount()), Q(game.nodecount())
{
}